

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong unaff_RBP;
  undefined4 uVar18;
  ulong uVar19;
  size_t sVar20;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  int iVar25;
  int iVar65;
  int iVar66;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar67;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar54;
  StackItemT<embree::NodeRefPtr<4>_> SVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar61;
  undefined1 auVar62 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar63;
  StackItemT<embree::NodeRefPtr<4>_> SVar64;
  undefined1 auVar68 [64];
  vint4 bi;
  undefined1 auVar69 [16];
  vint4 bi_3;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi_1;
  undefined1 auVar72 [16];
  vint4 ai_1;
  vint4 ai_3;
  vint4 ai;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar50 [16];
  
  pSVar21 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 1.0000004)));
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  iVar25 = (tray->tfar).field_0.i[k];
  auVar68 = ZEXT1664(CONCAT412(iVar25,CONCAT48(iVar25,CONCAT44(iVar25,iVar25))));
  while (pSVar21 != stack) {
    pSVar14 = pSVar21 + -1;
    pSVar21 = pSVar21 + -1;
    if ((float)pSVar14->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar20 = (pSVar21->ptr).ptr;
      do {
        if ((sVar20 & 8) == 0) {
          fVar4 = *(float *)(ray + k * 4 + 0x70);
          uVar16 = (uint)sVar20 & 7;
          uVar15 = sVar20 & 0xfffffffffffffff0;
          uVar18 = (undefined4)(unaff_RBP >> 0x20);
          if (uVar16 == 3) {
            auVar36 = *(undefined1 (*) [16])(uVar15 + 0x80);
            auVar37 = *(undefined1 (*) [16])(uVar15 + 0x90);
            auVar38 = *(undefined1 (*) [16])(uVar15 + 0xa0);
            auVar76._4_4_ = fVar4;
            auVar76._0_4_ = fVar4;
            auVar76._8_4_ = fVar4;
            auVar76._12_4_ = fVar4;
            fVar5 = 1.0 - fVar4;
            auVar75._0_4_ = fVar4 * *(float *)(uVar15 + 0xe0);
            auVar75._4_4_ = fVar4 * *(float *)(uVar15 + 0xe4);
            auVar75._8_4_ = fVar4 * *(float *)(uVar15 + 0xe8);
            auVar75._12_4_ = fVar4 * *(float *)(uVar15 + 0xec);
            auVar48._0_4_ = fVar4 * *(float *)(uVar15 + 0xf0);
            auVar48._4_4_ = fVar4 * *(float *)(uVar15 + 0xf4);
            auVar48._8_4_ = fVar4 * *(float *)(uVar15 + 0xf8);
            auVar48._12_4_ = fVar4 * *(float *)(uVar15 + 0xfc);
            auVar79._4_4_ = fVar5;
            auVar79._0_4_ = fVar5;
            auVar79._8_4_ = fVar5;
            auVar79._12_4_ = fVar5;
            auVar49._0_4_ = fVar4 * *(float *)(uVar15 + 0x100);
            auVar49._4_4_ = fVar4 * *(float *)(uVar15 + 0x104);
            auVar49._8_4_ = fVar4 * *(float *)(uVar15 + 0x108);
            auVar49._12_4_ = fVar4 * *(float *)(uVar15 + 0x10c);
            auVar39 = ZEXT816(0) << 0x40;
            auVar50 = vfmadd231ps_fma(auVar75,auVar79,auVar39);
            auVar48 = vfmadd231ps_fma(auVar48,auVar79,auVar39);
            auVar49 = vfmadd231ps_fma(auVar49,auVar79,auVar39);
            auVar81._0_4_ = fVar4 * *(float *)(uVar15 + 0x110);
            auVar81._4_4_ = fVar4 * *(float *)(uVar15 + 0x114);
            auVar81._8_4_ = fVar4 * *(float *)(uVar15 + 0x118);
            auVar81._12_4_ = fVar4 * *(float *)(uVar15 + 0x11c);
            auVar39 = vmulps_avx512vl(auVar76,*(undefined1 (*) [16])(uVar15 + 0x120));
            auVar77._0_4_ = fVar4 * *(float *)(uVar15 + 0x130);
            auVar77._4_4_ = fVar4 * *(float *)(uVar15 + 0x134);
            auVar77._8_4_ = fVar4 * *(float *)(uVar15 + 0x138);
            auVar77._12_4_ = fVar4 * *(float *)(uVar15 + 0x13c);
            auVar40 = vaddps_avx512vl(auVar79,auVar81);
            auVar41 = vaddps_avx512vl(auVar79,auVar39);
            auVar42 = vaddps_avx512vl(auVar79,auVar77);
            auVar82._0_4_ = fVar3 * auVar36._0_4_;
            auVar82._4_4_ = fVar3 * auVar36._4_4_;
            auVar82._8_4_ = fVar3 * auVar36._8_4_;
            auVar82._12_4_ = fVar3 * auVar36._12_4_;
            auVar78._0_4_ = fVar3 * auVar37._0_4_;
            auVar78._4_4_ = fVar3 * auVar37._4_4_;
            auVar78._8_4_ = fVar3 * auVar37._8_4_;
            auVar78._12_4_ = fVar3 * auVar37._12_4_;
            auVar80._0_4_ = fVar3 * auVar38._0_4_;
            auVar80._4_4_ = fVar3 * auVar38._4_4_;
            auVar80._8_4_ = fVar3 * auVar38._8_4_;
            auVar80._12_4_ = fVar3 * auVar38._12_4_;
            auVar39._4_4_ = uVar2;
            auVar39._0_4_ = uVar2;
            auVar39._8_4_ = uVar2;
            auVar39._12_4_ = uVar2;
            auVar43 = vfmadd231ps_avx512vl(auVar82,auVar39,*(undefined1 (*) [16])(uVar15 + 0x50));
            auVar44 = vfmadd231ps_avx512vl(auVar78,auVar39,*(undefined1 (*) [16])(uVar15 + 0x60));
            auVar39 = vfmadd231ps_avx512vl(auVar80,auVar39,*(undefined1 (*) [16])(uVar15 + 0x70));
            auVar45._4_4_ = uVar1;
            auVar45._0_4_ = uVar1;
            auVar45._8_4_ = uVar1;
            auVar45._12_4_ = uVar1;
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar45,*(undefined1 (*) [16])(uVar15 + 0x20));
            auVar44 = vfmadd231ps_avx512vl(auVar44,auVar45,*(undefined1 (*) [16])(uVar15 + 0x30));
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,*(undefined1 (*) [16])(uVar15 + 0x40));
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar46 = vandps_avx512vl(auVar43,auVar45);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            uVar19 = vcmpps_avx512vl(auVar46,auVar47,1);
            bVar8 = (bool)((byte)uVar19 & 1);
            iVar25 = auVar47._0_4_;
            auVar46._0_4_ = (uint)bVar8 * iVar25 | (uint)!bVar8 * auVar43._0_4_;
            bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
            iVar65 = auVar47._4_4_;
            auVar46._4_4_ = (uint)bVar8 * iVar65 | (uint)!bVar8 * auVar43._4_4_;
            bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
            iVar66 = auVar47._8_4_;
            iVar67 = auVar47._12_4_;
            auVar46._8_4_ = (uint)bVar8 * iVar66 | (uint)!bVar8 * auVar43._8_4_;
            bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar46._12_4_ = (uint)bVar8 * iVar67 | (uint)!bVar8 * auVar43._12_4_;
            auVar43 = vandps_avx512vl(auVar44,auVar45);
            uVar19 = vcmpps_avx512vl(auVar43,auVar47,1);
            bVar8 = (bool)((byte)uVar19 & 1);
            auVar43._0_4_ = (uint)bVar8 * iVar25 | (uint)!bVar8 * auVar44._0_4_;
            bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
            auVar43._4_4_ = (uint)bVar8 * iVar65 | (uint)!bVar8 * auVar44._4_4_;
            bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
            auVar43._8_4_ = (uint)bVar8 * iVar66 | (uint)!bVar8 * auVar44._8_4_;
            bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar43._12_4_ = (uint)bVar8 * iVar67 | (uint)!bVar8 * auVar44._12_4_;
            auVar45 = vandps_avx512vl(auVar39,auVar45);
            uVar19 = vcmpps_avx512vl(auVar45,auVar47,1);
            bVar8 = (bool)((byte)uVar19 & 1);
            auVar44._0_4_ = (uint)bVar8 * iVar25 | (uint)!bVar8 * auVar39._0_4_;
            bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar8 * iVar65 | (uint)!bVar8 * auVar39._4_4_;
            bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar8 * iVar66 | (uint)!bVar8 * auVar39._8_4_;
            bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar44._12_4_ = (uint)bVar8 * iVar67 | (uint)!bVar8 * auVar39._12_4_;
            auVar39 = vrcp14ps_avx512vl(auVar46);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar46 = vfnmadd213ps_avx512vl(auVar46,auVar39,auVar45);
            auVar39 = vfmadd132ps_avx512vl(auVar46,auVar39,auVar39);
            auVar46 = vrcp14ps_avx512vl(auVar43);
            auVar43 = vfnmadd213ps_avx512vl(auVar43,auVar46,auVar45);
            auVar43 = vfmadd132ps_avx512vl(auVar43,auVar46,auVar46);
            auVar46 = vrcp14ps_avx512vl(auVar44);
            auVar45 = vfnmadd213ps_avx512vl(auVar44,auVar46,auVar45);
            auVar45 = vfmadd132ps_avx512vl(auVar45,auVar46,auVar46);
            auVar36 = vfmadd213ps_avx512vl(auVar36,auVar28,*(undefined1 (*) [16])(uVar15 + 0xb0));
            auVar36 = vfmadd231ps_avx512vl(auVar36,auVar27,*(undefined1 (*) [16])(uVar15 + 0x50));
            auVar37 = vfmadd213ps_avx512vl(auVar37,auVar28,*(undefined1 (*) [16])(uVar15 + 0xc0));
            auVar37 = vfmadd231ps_avx512vl(auVar37,auVar27,*(undefined1 (*) [16])(uVar15 + 0x60));
            auVar38 = vfmadd213ps_avx512vl(auVar38,auVar28,*(undefined1 (*) [16])(uVar15 + 0xd0));
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar27,*(undefined1 (*) [16])(uVar15 + 0x70));
            auVar44 = vfmadd231ps_avx512vl(auVar36,auVar26,*(undefined1 (*) [16])(uVar15 + 0x20));
            auVar46 = vfmadd231ps_avx512vl(auVar37,auVar26,*(undefined1 (*) [16])(uVar15 + 0x30));
            auVar47 = vfmadd231ps_avx512vl(auVar38,auVar26,*(undefined1 (*) [16])(uVar15 + 0x40));
            auVar36 = vsubps_avx(auVar50,auVar44);
            auVar50 = vsubps_avx512vl(auVar40,auVar44);
            auVar37 = vsubps_avx(auVar48,auVar46);
            auVar48 = vsubps_avx512vl(auVar41,auVar46);
            auVar38 = vsubps_avx(auVar49,auVar47);
            auVar49 = vsubps_avx512vl(auVar42,auVar47);
            auVar42._0_4_ = auVar39._0_4_ * auVar36._0_4_;
            auVar42._4_4_ = auVar39._4_4_ * auVar36._4_4_;
            auVar42._8_4_ = auVar39._8_4_ * auVar36._8_4_;
            auVar42._12_4_ = auVar39._12_4_ * auVar36._12_4_;
            auVar41._0_4_ = auVar39._0_4_ * auVar50._0_4_;
            auVar41._4_4_ = auVar39._4_4_ * auVar50._4_4_;
            auVar41._8_4_ = auVar39._8_4_ * auVar50._8_4_;
            auVar41._12_4_ = auVar39._12_4_ * auVar50._12_4_;
            auVar47._0_4_ = auVar43._0_4_ * auVar37._0_4_;
            auVar47._4_4_ = auVar43._4_4_ * auVar37._4_4_;
            auVar47._8_4_ = auVar43._8_4_ * auVar37._8_4_;
            auVar47._12_4_ = auVar43._12_4_ * auVar37._12_4_;
            auVar73._0_4_ = auVar45._0_4_ * auVar38._0_4_;
            auVar73._4_4_ = auVar45._4_4_ * auVar38._4_4_;
            auVar73._8_4_ = auVar45._8_4_ * auVar38._8_4_;
            auVar73._12_4_ = auVar45._12_4_ * auVar38._12_4_;
            auVar40._0_4_ = auVar43._0_4_ * auVar48._0_4_;
            auVar40._4_4_ = auVar43._4_4_ * auVar48._4_4_;
            auVar40._8_4_ = auVar43._8_4_ * auVar48._8_4_;
            auVar40._12_4_ = auVar43._12_4_ * auVar48._12_4_;
            auVar50._0_4_ = auVar45._0_4_ * auVar49._0_4_;
            auVar50._4_4_ = auVar45._4_4_ * auVar49._4_4_;
            auVar50._8_4_ = auVar45._8_4_ * auVar49._8_4_;
            auVar50._12_4_ = auVar45._12_4_ * auVar49._12_4_;
            auVar36 = vpminsd_avx(auVar47,auVar40);
            auVar37 = vpminsd_avx(auVar73,auVar50);
            auVar36 = vmaxps_avx(auVar36,auVar37);
            auVar48 = vpminsd_avx(auVar42,auVar41);
            auVar38 = vpmaxsd_avx(auVar42,auVar41);
            auVar37 = vpmaxsd_avx(auVar47,auVar40);
            auVar50 = vpmaxsd_avx(auVar73,auVar50);
            auVar37 = vminps_avx(auVar37,auVar50);
            auVar50 = vmaxps_avx512vl(auVar35,auVar48);
            auVar36 = vmaxps_avx(auVar50,auVar36);
            auVar38 = vminps_avx(auVar68._0_16_,auVar38);
            auVar37 = vminps_avx(auVar38,auVar37);
            auVar38._8_4_ = 0x3f7ffffa;
            auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
            auVar38._12_4_ = 0x3f7ffffa;
            tNear.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmulps_avx512vl(auVar36,auVar38);
            auVar36._8_4_ = 0x3f800003;
            auVar36._0_8_ = 0x3f8000033f800003;
            auVar36._12_4_ = 0x3f800003;
            auVar36 = vmulps_avx512vl(auVar37,auVar36);
            uVar10 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar36,2);
            unaff_RBP = CONCAT44(uVar18,(uint)(byte)uVar10);
          }
          else {
            auVar69._4_4_ = fVar4;
            auVar69._0_4_ = fVar4;
            auVar69._8_4_ = fVar4;
            auVar69._12_4_ = fVar4;
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar22),auVar69,
                                      *(undefined1 (*) [16])(uVar15 + 0x20 + uVar22));
            auVar36 = vsubps_avx512vl(auVar36,auVar26);
            auVar37 = vmulps_avx512vl(auVar29,auVar36);
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar17),auVar69,
                                      *(undefined1 (*) [16])(uVar15 + 0x20 + uVar17));
            auVar36 = vsubps_avx512vl(auVar36,auVar27);
            auVar38 = vmulps_avx512vl(auVar30,auVar36);
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar23),auVar69,
                                      *(undefined1 (*) [16])(uVar15 + 0x20 + uVar23));
            auVar36 = vsubps_avx512vl(auVar36,auVar28);
            auVar36 = vmulps_avx512vl(auVar31,auVar36);
            auVar36 = vmaxps_avx(auVar38,auVar36);
            auVar37 = vmaxps_avx512vl(auVar35,auVar37);
            tNear.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar37,auVar36);
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar22 ^ 0x10)),
                                      auVar69,*(undefined1 (*) [16])
                                               (uVar15 + 0x20 + (uVar22 ^ 0x10)));
            auVar36 = vsubps_avx512vl(auVar36,auVar26);
            auVar37 = vmulps_avx512vl(auVar32,auVar36);
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar17 ^ 0x10)),
                                      auVar69,*(undefined1 (*) [16])
                                               (uVar15 + 0x20 + (uVar17 ^ 0x10)));
            auVar36 = vsubps_avx512vl(auVar36,auVar27);
            auVar38 = vmulps_avx512vl(auVar33,auVar36);
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar23 ^ 0x10)),
                                      auVar69,*(undefined1 (*) [16])
                                               (uVar15 + 0x20 + (uVar23 ^ 0x10)));
            auVar36 = vsubps_avx512vl(auVar36,auVar28);
            auVar36 = vmulps_avx512vl(auVar34,auVar36);
            auVar36 = vminps_avx(auVar38,auVar36);
            auVar37 = vminps_avx(auVar68._0_16_,auVar37);
            auVar36 = vminps_avx(auVar37,auVar36);
            uVar10 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar36,2);
            bVar24 = (byte)uVar10;
            if (uVar16 == 6) {
              uVar10 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
              uVar11 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [16])(uVar15 + 0xe0),0xd);
              bVar24 = (byte)uVar10 & (byte)uVar11 & bVar24;
            }
            unaff_RBP = CONCAT44(uVar18,(uint)bVar24);
          }
        }
        if ((sVar20 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar25 = 4;
          }
          else {
            uVar19 = sVar20 & 0xfffffffffffffff0;
            lVar12 = 0;
            for (uVar15 = unaff_RBP; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            iVar25 = 0;
            uVar15 = unaff_RBP - 1 & unaff_RBP;
            sVar20 = *(ulong *)(uVar19 + lVar12 * 8);
            if (uVar15 != 0) {
              uVar16 = tNear.field_0.i[lVar12];
              lVar12 = 0;
              for (uVar13 = uVar15; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              uVar13 = *(ulong *)(uVar19 + lVar12 * 8);
              uVar7 = tNear.field_0.i[lVar12];
              if (uVar15 == 0) {
                if (uVar16 < uVar7) {
                  (pSVar21->ptr).ptr = uVar13;
                  pSVar21->dist = uVar7;
                  pSVar21 = pSVar21 + 1;
                }
                else {
                  (pSVar21->ptr).ptr = sVar20;
                  pSVar21->dist = uVar16;
                  sVar20 = uVar13;
                  pSVar21 = pSVar21 + 1;
                }
              }
              else {
                auVar37._8_8_ = 0;
                auVar37._0_8_ = sVar20;
                auVar36 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar16));
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar13;
                auVar37 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar7));
                lVar12 = 0;
                for (uVar13 = uVar15; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar12 = lVar12 + 1;
                }
                uVar15 = uVar15 - 1 & uVar15;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = *(ulong *)(uVar19 + lVar12 * 8);
                auVar49 = vpunpcklqdq_avx(auVar71,ZEXT416((uint)tNear.field_0.i[lVar12]));
                auVar38 = vpshufd_avx(auVar36,0xaa);
                auVar50 = vpshufd_avx(auVar37,0xaa);
                auVar48 = vpshufd_avx(auVar49,0xaa);
                if (uVar15 == 0) {
                  uVar15 = vpcmpgtd_avx512vl(auVar50,auVar38);
                  uVar15 = uVar15 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar37,auVar36);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar51._0_4_ = (uint)bVar8 * auVar50._0_4_ | (uint)!bVar8 * auVar38._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar51._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar38._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar51._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar38._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar51._12_4_ = (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar38._12_4_;
                  auVar37 = vmovdqa32_avx512vl(auVar37);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar52._0_4_ = (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar36._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * auVar36._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar52._12_4_ = (uint)bVar8 * auVar37._12_4_ | (uint)!bVar8 * auVar36._12_4_;
                  auVar36 = vpshufd_avx(auVar51,0xaa);
                  uVar15 = vpcmpgtd_avx512vl(auVar48,auVar36);
                  uVar15 = uVar15 & 0xf;
                  auVar37 = vpblendmd_avx512vl(auVar49,auVar51);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  bVar9 = (bool)((byte)(uVar15 >> 1) & 1);
                  sVar20 = CONCAT44((uint)bVar9 * auVar37._4_4_ | (uint)!bVar9 * auVar36._4_4_,
                                    (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_);
                  auVar36 = vmovdqa32_avx512vl(auVar49);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar53._0_4_ = (uint)bVar8 * auVar36._0_4_ | !bVar8 * auVar51._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar8 * auVar36._4_4_ | !bVar8 * auVar51._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar8 * auVar36._8_4_ | !bVar8 * auVar51._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar53._12_4_ = (uint)bVar8 * auVar36._12_4_ | !bVar8 * auVar51._12_4_;
                  auVar36 = vpshufd_avx(auVar53,0xaa);
                  auVar37 = vpshufd_avx(auVar52,0xaa);
                  uVar15 = vpcmpgtd_avx512vl(auVar36,auVar37);
                  uVar15 = uVar15 & 0xf;
                  auVar37 = vpblendmd_avx512vl(auVar53,auVar52);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  SVar54.ptr.ptr._0_4_ = (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  SVar54.ptr.ptr._4_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar36._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  SVar54.dist = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * auVar36._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  SVar54._12_4_ = (uint)bVar8 * auVar37._12_4_ | (uint)!bVar8 * auVar36._12_4_;
                  auVar36 = vmovdqa32_avx512vl(auVar53);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  SVar55.ptr.ptr._0_4_ = (uint)bVar8 * auVar36._0_4_ | !bVar8 * auVar52._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  SVar55.ptr.ptr._4_4_ = (uint)bVar8 * auVar36._4_4_ | !bVar8 * auVar52._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  SVar55.dist = (uint)bVar8 * auVar36._8_4_ | !bVar8 * auVar52._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  SVar55._12_4_ = (uint)bVar8 * auVar36._12_4_ | !bVar8 * auVar52._12_4_;
                  *pSVar21 = SVar55;
                  pSVar21[1] = SVar54;
                  pSVar21 = pSVar21 + 2;
                }
                else {
                  lVar12 = 0;
                  for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                    lVar12 = lVar12 + 1;
                  }
                  uVar16 = tNear.field_0.i[lVar12];
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = *(ulong *)(uVar19 + lVar12 * 8);
                  auVar39 = vpunpcklqdq_avx(auVar74,ZEXT416(uVar16));
                  uVar15 = vpcmpgtd_avx512vl(auVar50,auVar38);
                  uVar15 = uVar15 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar37,auVar36);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar56._0_4_ = (uint)bVar8 * auVar50._0_4_ | (uint)!bVar8 * auVar38._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar38._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar38._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar56._12_4_ = (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar38._12_4_;
                  auVar37 = vmovdqa32_avx512vl(auVar37);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar57._0_4_ = (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar57._4_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar36._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar57._8_4_ = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * auVar36._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar57._12_4_ = (uint)bVar8 * auVar37._12_4_ | (uint)!bVar8 * auVar36._12_4_;
                  auVar72._4_4_ = uVar16;
                  auVar72._0_4_ = uVar16;
                  auVar72._8_4_ = uVar16;
                  auVar72._12_4_ = uVar16;
                  uVar15 = vpcmpgtd_avx512vl(auVar72,auVar48);
                  uVar15 = uVar15 & 0xf;
                  auVar36 = vpblendmd_avx512vl(auVar39,auVar49);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar58._0_4_ = (uint)bVar8 * auVar36._0_4_ | !bVar8 * uVar16;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar8 * auVar36._4_4_ | !bVar8 * uVar16;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar8 * auVar36._8_4_ | !bVar8 * uVar16;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar58._12_4_ = (uint)bVar8 * auVar36._12_4_ | !bVar8 * uVar16;
                  auVar36 = vmovdqa32_avx512vl(auVar39);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar59._0_4_ = (uint)bVar8 * auVar36._0_4_ | (uint)!bVar8 * auVar49._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar8 * auVar36._4_4_ | (uint)!bVar8 * auVar49._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar8 * auVar36._8_4_ | (uint)!bVar8 * auVar49._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar59._12_4_ = (uint)bVar8 * auVar36._12_4_ | (uint)!bVar8 * auVar49._12_4_;
                  auVar36 = vpshufd_avx(auVar59,0xaa);
                  auVar37 = vpshufd_avx(auVar57,0xaa);
                  uVar15 = vpcmpgtd_avx512vl(auVar36,auVar37);
                  uVar15 = uVar15 & 0xf;
                  auVar37 = vpblendmd_avx512vl(auVar59,auVar57);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar60._0_4_ = (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar60._4_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar36._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar60._8_4_ = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * auVar36._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar60._12_4_ = (uint)bVar8 * auVar37._12_4_ | (uint)!bVar8 * auVar36._12_4_;
                  auVar36 = vmovdqa32_avx512vl(auVar59);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  SVar61.ptr.ptr._0_4_ = (uint)bVar8 * auVar36._0_4_ | !bVar8 * auVar57._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  SVar61.ptr.ptr._4_4_ = (uint)bVar8 * auVar36._4_4_ | !bVar8 * auVar57._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  SVar61.dist = (uint)bVar8 * auVar36._8_4_ | !bVar8 * auVar57._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  SVar61._12_4_ = (uint)bVar8 * auVar36._12_4_ | !bVar8 * auVar57._12_4_;
                  auVar36 = vpshufd_avx(auVar58,0xaa);
                  auVar37 = vpshufd_avx(auVar56,0xaa);
                  uVar15 = vpcmpgtd_avx512vl(auVar36,auVar37);
                  uVar15 = uVar15 & 0xf;
                  auVar37 = vpblendmd_avx512vl(auVar58,auVar56);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  bVar9 = (bool)((byte)(uVar15 >> 1) & 1);
                  sVar20 = CONCAT44((uint)bVar9 * auVar37._4_4_ | (uint)!bVar9 * auVar36._4_4_,
                                    (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_);
                  auVar36 = vmovdqa32_avx512vl(auVar58);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  auVar62._0_4_ = (uint)bVar8 * auVar36._0_4_ | !bVar8 * auVar56._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar62._4_4_ = (uint)bVar8 * auVar36._4_4_ | !bVar8 * auVar56._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar62._8_4_ = (uint)bVar8 * auVar36._8_4_ | !bVar8 * auVar56._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  auVar62._12_4_ = (uint)bVar8 * auVar36._12_4_ | !bVar8 * auVar56._12_4_;
                  auVar36 = vpshufd_avx(auVar62,0xaa);
                  auVar37 = vpshufd_avx(auVar60,0xaa);
                  uVar15 = vpcmpgtd_avx512vl(auVar37,auVar36);
                  uVar15 = uVar15 & 0xf;
                  auVar37 = vpblendmd_avx512vl(auVar60,auVar62);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  SVar63.ptr.ptr._0_4_ = (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar36._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  SVar63.ptr.ptr._4_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar36._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  SVar63.dist = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * auVar36._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  SVar63._12_4_ = (uint)bVar8 * auVar37._12_4_ | (uint)!bVar8 * auVar36._12_4_;
                  auVar36 = vmovdqa32_avx512vl(auVar60);
                  bVar8 = (bool)((byte)uVar15 & 1);
                  SVar64.ptr.ptr._0_4_ = (uint)bVar8 * auVar36._0_4_ | !bVar8 * auVar62._0_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                  SVar64.ptr.ptr._4_4_ = (uint)bVar8 * auVar36._4_4_ | !bVar8 * auVar62._4_4_;
                  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
                  SVar64.dist = (uint)bVar8 * auVar36._8_4_ | !bVar8 * auVar62._8_4_;
                  bVar8 = SUB81(uVar15 >> 3,0);
                  SVar64._12_4_ = (uint)bVar8 * auVar36._12_4_ | !bVar8 * auVar62._12_4_;
                  *pSVar21 = SVar61;
                  pSVar21[1] = SVar64;
                  pSVar21[2] = SVar63;
                  pSVar21 = pSVar21 + 3;
                }
              }
            }
          }
        }
        else {
          iVar25 = 6;
        }
      } while (iVar25 == 0);
      if (iVar25 == 6) {
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(sVar20 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context)
        ;
        uVar18 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar68 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(uVar18,uVar18))));
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }